

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::quadratic_cost_type<double>::make_l1_norm(quadratic_cost_type<double> *this,int n)

{
  double *pdVar1;
  double *pdVar2;
  quad *pqVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  double dVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar20 [64];
  
  if (n == 0) {
    auVar23 = ZEXT1664(ZEXT816(0));
  }
  else {
    auVar24._8_8_ = 0x7fffffffffffffff;
    auVar24._0_8_ = 0x7fffffffffffffff;
    auVar23 = ZEXT1664(ZEXT816(0));
    uVar13 = 0;
    do {
      auVar26._8_8_ = 0;
      auVar26._0_8_ =
           (this->linear_elements)._M_t.
           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl[uVar13];
      uVar13 = uVar13 + 1;
      auVar26 = vandpd_avx(auVar26,auVar24);
      auVar23 = ZEXT864((ulong)(auVar23._0_8_ + auVar26._0_8_));
    } while ((uint)n != uVar13);
  }
  auVar22 = auVar23._0_16_;
  uVar13 = (ulong)(uint)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>
                        ._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl[n];
  if (uVar13 != 0) {
    auVar25._8_8_ = 0x7fffffffffffffff;
    auVar25._0_8_ = 0x7fffffffffffffff;
    lVar14 = 0;
    do {
      auVar27._8_8_ = 0;
      auVar27._0_8_ =
           *(ulong *)((long)&((this->quadratic_elements)._M_t.
                              super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                              .
                              super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                             ._M_head_impl)->factor + lVar14);
      lVar14 = lVar14 + 0x10;
      auVar24 = vandpd_avx(auVar27,auVar25);
      dVar11 = auVar23._0_8_ + auVar24._0_8_;
      auVar23 = ZEXT864((ulong)dVar11);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar11;
    } while (uVar13 << 4 != lVar14);
  }
  if ((uint)((auVar22._0_8_ & 0x7fffffffffffffff) + 0xfff0000000000000 >> 0x35) < 0x3ff) {
    if (n != 0) {
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      pdVar2 = (this->linear_elements)._M_t.
               super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl;
      auVar16 = vbroadcastsd_avx512f(auVar22);
      auVar17 = vpbroadcastq_avx512f();
      uVar15 = 0;
      do {
        auVar18 = vpbroadcastq_avx512f();
        auVar18 = vporq_avx512f(auVar18,auVar23);
        uVar12 = vpcmpuq_avx512f(auVar18,auVar17,2);
        pdVar1 = pdVar2 + uVar15;
        auVar18._8_8_ = (ulong)((byte)(uVar12 >> 1) & 1) * (long)pdVar1[1];
        auVar18._0_8_ = (ulong)((byte)uVar12 & 1) * (long)*pdVar1;
        auVar18._16_8_ = (ulong)((byte)(uVar12 >> 2) & 1) * (long)pdVar1[2];
        auVar18._24_8_ = (ulong)((byte)(uVar12 >> 3) & 1) * (long)pdVar1[3];
        auVar18._32_8_ = (ulong)((byte)(uVar12 >> 4) & 1) * (long)pdVar1[4];
        auVar18._40_8_ = (ulong)((byte)(uVar12 >> 5) & 1) * (long)pdVar1[5];
        auVar18._48_8_ = (ulong)((byte)(uVar12 >> 6) & 1) * (long)pdVar1[6];
        auVar18._56_8_ = (uVar12 >> 7) * (long)pdVar1[7];
        auVar18 = vdivpd_avx512f(auVar18,auVar16);
        pdVar1 = pdVar2 + uVar15;
        bVar4 = (bool)((byte)uVar12 & 1);
        bVar5 = (bool)((byte)(uVar12 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar12 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar12 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar12 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar12 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar12 >> 6) & 1);
        *pdVar1 = (double)((ulong)bVar4 * auVar18._0_8_ | (ulong)!bVar4 * (long)*pdVar1);
        pdVar1[1] = (double)((ulong)bVar5 * auVar18._8_8_ | (ulong)!bVar5 * (long)pdVar1[1]);
        pdVar1[2] = (double)((ulong)bVar6 * auVar18._16_8_ | (ulong)!bVar6 * (long)pdVar1[2]);
        pdVar1[3] = (double)((ulong)bVar7 * auVar18._24_8_ | (ulong)!bVar7 * (long)pdVar1[3]);
        pdVar1[4] = (double)((ulong)bVar8 * auVar18._32_8_ | (ulong)!bVar8 * (long)pdVar1[4]);
        pdVar1[5] = (double)((ulong)bVar9 * auVar18._40_8_ | (ulong)!bVar9 * (long)pdVar1[5]);
        pdVar1[6] = (double)((ulong)bVar10 * auVar18._48_8_ | (ulong)!bVar10 * (long)pdVar1[6]);
        pdVar1[7] = (double)((uVar12 >> 7) * auVar18._56_8_ |
                            (ulong)!SUB81(uVar12 >> 7,0) * (long)pdVar1[7]);
        uVar15 = uVar15 + 8;
      } while (((ulong)(uint)n + 7 & 0x1fffffff8) != uVar15);
    }
    if (uVar13 != 0) {
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar16 = vpbroadcastq_avx512f(ZEXT816(8));
      pqVar3 = (this->quadratic_elements)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
               .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
               _M_head_impl;
      auVar17 = vbroadcastsd_avx512f(auVar22);
      uVar13 = uVar13 + 7 & 0x1fffffff8;
      auVar18 = vpbroadcastq_avx512f();
      do {
        uVar15 = vpcmpuq_avx512f(auVar23,auVar18,2);
        auVar19 = vpsllq_avx512f(auVar23,4);
        auVar23 = vpaddq_avx512f(auVar23,auVar16);
        uVar13 = uVar13 - 8;
        auVar20 = vgatherqpd_avx512f(pqVar3->factor);
        auVar21._8_8_ = (ulong)((byte)(uVar15 >> 1) & 1) * auVar20._8_8_;
        auVar21._0_8_ = (ulong)((byte)uVar15 & 1) * auVar20._0_8_;
        auVar21._16_8_ = (ulong)((byte)(uVar15 >> 2) & 1) * auVar20._16_8_;
        auVar21._24_8_ = (ulong)((byte)(uVar15 >> 3) & 1) * auVar20._24_8_;
        auVar21._32_8_ = (ulong)((byte)(uVar15 >> 4) & 1) * auVar20._32_8_;
        auVar21._40_8_ = (ulong)((byte)(uVar15 >> 5) & 1) * auVar20._40_8_;
        auVar21._48_8_ = (ulong)((byte)(uVar15 >> 6) & 1) * auVar20._48_8_;
        auVar21._56_8_ = (uVar15 >> 7) * auVar20._56_8_;
        auVar20 = vdivpd_avx512f(auVar21,auVar17);
        vscatterqpd_avx512f(ZEXT864(pqVar3) + auVar19,uVar15,auVar20);
      } while (uVar13 != 0);
    }
  }
  return;
}

Assistant:

void make_l1_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += std::abs(linear_elements[i]);

        for (int i = 0, e = indices[n]; i != e; ++i)
            div += std::abs(quadratic_elements[i].factor);

        if (std::isnormal(div)) {
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;

            for (int i = 0, e = indices[n]; i != e; ++i)
                quadratic_elements[i].factor /= div;
        }
    }